

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O3

void Qentem::Test::TestSuperVariableTag1(QTest *test)

{
  long lVar1;
  char *pcVar2;
  Value<char> *pVVar3;
  long lVar4;
  Value<char> value;
  Array<Qentem::Tags::TagBit> tags_cache;
  StringStream<char> ss;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_98;
  char local_88;
  Array<Qentem::Tags::TagBit> local_78;
  StringStream<char> local_68;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> local_58;
  
  local_88 = 0;
  local_68.storage_ = (char *)0x0;
  local_68.length_ = 0;
  local_68.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  Value<char>::reset((Value<char> *)&local_98.array_);
  local_88 = '\x02';
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"a",1);
  Value<char>::operator=(pVVar3,"a");
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"b",1);
  Value<char>::operator=(pVVar3,"bb");
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"c",1);
  Value<char>::operator=(pVVar3,"ccc");
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"d",1);
  Value<char>::operator=(pVVar3,"dddd");
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"4",1);
  Value<char>::operator=(pVVar3,"e");
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"e",1);
  Value<char>::operator=(pVVar3,"f");
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,
                      "ffffff",6);
  Value<char>::operator=(pVVar3,"g");
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"g",1);
  Value<char>::reset(pVVar3);
  (pVVar3->field_0).array_.storage_ = (Value<char> *)0xa;
  pVVar3->type_ = IntLong;
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"h",1);
  Value<char>::reset(pVVar3);
  pVVar3->type_ = True;
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,
                      "999999999",9);
  Value<char>::operator=(pVVar3,"8000000000007779999999");
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"x_y_z"
                      ,5);
  Value<char>::operator=(pVVar3,"the value is {0}");
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_58.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_58.value_ = (Value<char> *)0x0;
  local_58.stream_ = (StringStream<char> *)0x0;
  local_58.content_ = "{svar:x_y_z, {var:a}}";
  local_58.length_ = 0x15;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{svar:x_y_z, {var:a}}",0x15,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_58,&local_78,(Value<char> *)&local_98.array_,&local_68);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[15]>
            (test,&local_68,(char (*) [15])"the value is a",0x8cc);
  local_58.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
  local_58.value_ = (Value<char> *)0x0;
  local_58.stream_ = (StringStream<char> *)0x0;
  local_58.content_ = "..{svar:x_y_z, {var:d}}--";
  local_58.length_ = 0x19;
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("..{svar:x_y_z, {var:d}}--",0x19,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_58,&local_78,(Value<char> *)&local_98.array_,&local_68);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[22]>
            (test,&local_68,(char (*) [22])"..the value is dddd--",0x8cf);
  local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
  local_58.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_58.value_ = (Value<char> *)0x0;
  local_58.stream_ = (StringStream<char> *)0x0;
  local_58.content_ = ".{svar:x_y_z, {var:g}}-";
  local_58.length_ = 0x17;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            (".{svar:x_y_z, {var:g}}-",0x17,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_58,&local_78,(Value<char> *)&local_98.array_,&local_68);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[18]>
            (test,&local_68,(char (*) [18])".the value is 10-",0x8d2);
  local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
  local_58.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_58.value_ = (Value<char> *)0x0;
  local_58.stream_ = (StringStream<char> *)0x0;
  local_58.content_ = ".{svar:x_y_z, {var:h}}";
  local_58.length_ = 0x16;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            (".{svar:x_y_z, {var:h}}",0x16,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_58,&local_78,(Value<char> *)&local_98.array_,&local_68);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[19]>
            (test,&local_68,(char (*) [19])".the value is true",0x8d5);
  local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
  local_58.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_58.value_ = (Value<char> *)0x0;
  local_58.stream_ = (StringStream<char> *)0x0;
  local_58.content_ = "{svar:x_y_z, {var:999999999}}x";
  local_58.length_ = 0x1e;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{svar:x_y_z, {var:999999999}}x",0x1e,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_58,&local_78,(Value<char> *)&local_98.array_,&local_68);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[37]>
            (test,&local_68,(char (*) [37])"the value is 8000000000007779999999x",0x8d9);
  local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"x_y_z"
                      ,5);
  Value<char>::operator=(pVVar3,"{0}");
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_58.value_ = (Value<char> *)0x0;
  local_58.stream_ = (StringStream<char> *)0x0;
  local_58.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_58.content_ = "{svar:x_y_z, {var:4}}";
  local_58.length_ = 0x15;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{svar:x_y_z, {var:4}}",0x15,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_58,&local_78,(Value<char> *)&local_98.array_,&local_68);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[2]>(test,&local_68,(char (*) [2])0x1355c0,0x8de);
  local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"x_y_z"
                      ,5);
  Value<char>::operator=(pVVar3,"{0}{0} {0} {0}{0}{0}");
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_58.value_ = (Value<char> *)0x0;
  local_58.stream_ = (StringStream<char> *)0x0;
  local_58.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_58.content_ = "{svar:x_y_z, {var:ffffff}}";
  local_58.length_ = 0x1a;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{svar:x_y_z, {var:ffffff}}",0x1a,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_58,&local_78,(Value<char> *)&local_98.array_,&local_68);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,&local_68,(char (*) [9])"gg g ggg",0x8e3);
  local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"x_y_z"
                      ,5);
  Value<char>::operator=(pVVar3,"{0},{1}.{2}-{3}**{4}////{5}=={6} {7} {8} {9}");
  lVar4 = 0;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while ("{svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}}"
           [lVar1] != '\0');
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_58.value_ = (Value<char> *)0x0;
  local_58.stream_ = (StringStream<char> *)0x0;
  local_58.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_58.content_ =
       "{svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}}"
  ;
  local_58.length_ = (SizeT)lVar4;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}}"
             ,local_58.length_,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_58,&local_78,(Value<char> *)&local_98.array_,&local_68);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[56]>
            (test,&local_68,(char (*) [56])"g,a.e-8000000000007779999999**10////true==ccc dddd bb f"
             ,0x8ec);
  local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"a",1);
  Value<char>::operator=(pVVar3,"\'a");
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"b",1);
  Value<char>::operator=(pVVar3,"<>bb");
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"x_y_z"
                      ,5);
  Value<char>::operator=(pVVar3,"{0},{1}.{2}-{3}**{4}////{5}=={6} {7} {8} {9}");
  lVar4 = 0;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while ("{svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}}"
           [lVar1] != '\0');
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_58.value_ = (Value<char> *)0x0;
  local_58.stream_ = (StringStream<char> *)0x0;
  local_58.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_58.content_ =
       "{svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}}"
  ;
  local_58.length_ = (SizeT)lVar4;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}}"
             ,local_58.length_,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_58,&local_78,(Value<char> *)&local_98.array_,&local_68);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[70]>
            (test,&local_68,
             (char (*) [70])"g,&apos;a.e-8000000000007779999999**10////true==ccc dddd &lt;&gt;bb f",
             0x8f9);
  lVar4 = 0;
  local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while ("{svar:x_y_z, {raw:ffffff}, {raw:a}, {raw:4}, {raw:999999999}, {raw:g}, {raw:h}, {raw:c}, {raw:d}, {raw:b}, {raw:e}}"
           [lVar1] != '\0');
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_58.value_ = (Value<char> *)0x0;
  local_58.stream_ = (StringStream<char> *)0x0;
  local_58.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_58.content_ =
       "{svar:x_y_z, {raw:ffffff}, {raw:a}, {raw:4}, {raw:999999999}, {raw:g}, {raw:h}, {raw:c}, {raw:d}, {raw:b}, {raw:e}}"
  ;
  local_58.length_ = (SizeT)lVar4;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{svar:x_y_z, {raw:ffffff}, {raw:a}, {raw:4}, {raw:999999999}, {raw:g}, {raw:h}, {raw:c}, {raw:d}, {raw:b}, {raw:e}}"
             ,local_58.length_,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_58,&local_78,(Value<char> *)&local_98.array_,&local_68);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[59]>
            (test,&local_68,
             (char (*) [59])"g,\'a.e-8000000000007779999999**10////true==ccc dddd <>bb f",0x908);
  local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"a",1);
  Value<char>::reset(pVVar3);
  (pVVar3->field_0).array_.storage_ = (Value<char> *)0xa;
  pVVar3->type_ = IntLong;
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"b",1);
  Value<char>::reset(pVVar3);
  (pVVar3->field_0).array_.storage_ = (Value<char> *)0x5;
  pVVar3->type_ = IntLong;
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"c",1);
  Value<char>::reset(pVVar3);
  (pVVar3->field_0).array_.storage_ = (Value<char> *)0x3;
  pVVar3->type_ = IntLong;
  if (local_88 != '\x02') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                     ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"x_y_z"
                      ,5);
  Value<char>::operator=(pVVar3,"{0} {1} {2} {3} {4}");
  lVar4 = 0;
  do {
    lVar1 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while ("{svar:x_y_z, {math:{var:a}+{var:b}+{var:c}},\n    {math:{var:a}*{var:b}*{var:c}},\n    {math:{var:a}-{var:b}-{var:c}},\n    {math:{var:a}+{var:b}-{var:c}},\n    {math:{var:a}/{var:b}+{var:c}}}"
           [lVar1] != '\0');
  local_78.storage_ = (TagBit *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  local_58.value_ = (Value<char> *)0x0;
  local_58.stream_ = (StringStream<char> *)0x0;
  local_58.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_58.content_ =
       "{svar:x_y_z, {math:{var:a}+{var:b}+{var:c}},\n    {math:{var:a}*{var:b}*{var:c}},\n    {math:{var:a}-{var:b}-{var:c}},\n    {math:{var:a}+{var:b}-{var:c}},\n    {math:{var:a}/{var:b}+{var:c}}}"
  ;
  local_58.length_ = (SizeT)lVar4;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{svar:x_y_z, {math:{var:a}+{var:b}+{var:c}},\n    {math:{var:a}*{var:b}*{var:c}},\n    {math:{var:a}-{var:b}-{var:c}},\n    {math:{var:a}+{var:b}-{var:c}},\n    {math:{var:a}/{var:b}+{var:c}}}"
             ,local_58.length_,&local_78);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_58,&local_78,(Value<char> *)&local_98.array_,&local_68);
  Array<Qentem::Tags::TagBit>::~Array(&local_78);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,&local_68,(char (*) [14])"18 150 2 12 5",0x917);
  Value<char>::~Value((Value<char> *)&local_98.array_);
  pcVar2 = local_68.storage_;
  if (local_68.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_68.storage_);
  }
  operator_delete(pcVar2);
  return;
}

Assistant:

static void TestSuperVariableTag1(QTest &test) {
    StringStream<char> ss;
    Value<char>        value;

    value[R"(a)"]         = R"(a)";
    value[R"(b)"]         = R"(bb)";
    value[R"(c)"]         = R"(ccc)";
    value[R"(d)"]         = R"(dddd)";
    value[R"(4)"]         = R"(e)";
    value[R"(e)"]         = R"(f)";
    value[R"(ffffff)"]    = R"(g)";
    value[R"(g)"]         = 10;
    value[R"(h)"]         = true;
    value[R"(999999999)"] = R"(8000000000007779999999)";

    value[R"(x_y_z)"] = R"(the value is {0})";

    test.IsEqual(Template::Render(R"({svar:x_y_z, {var:a}})", value, ss), R"(the value is a)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(R"(..{svar:x_y_z, {var:d}}--)", value, ss), R"(..the value is dddd--)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(R"(.{svar:x_y_z, {var:g}}-)", value, ss), R"(.the value is 10-)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(R"(.{svar:x_y_z, {var:h}})", value, ss), R"(.the value is true)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(R"({svar:x_y_z, {var:999999999}}x)", value, ss),
                 R"(the value is 8000000000007779999999x)", __LINE__);
    ss.Clear();

    value[R"(x_y_z)"] = R"({0})";

    test.IsEqual(Template::Render(R"({svar:x_y_z, {var:4}})", value, ss), R"(e)", __LINE__);
    ss.Clear();

    value[R"(x_y_z)"] = R"({0}{0} {0} {0}{0}{0})";

    test.IsEqual(Template::Render(R"({svar:x_y_z, {var:ffffff}})", value, ss), R"(gg g ggg)", __LINE__);
    ss.Clear();

    value[R"(x_y_z)"] = R"({0},{1}.{2}-{3}**{4}////{5}=={6} {7} {8} {9})";

    test.IsEqual(
        Template::Render(
            R"({svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}})",
            value, ss),
        R"(g,a.e-8000000000007779999999**10////true==ccc dddd bb f)", __LINE__);
    ss.Clear();

    value[R"(a)"] = R"('a)";
    value[R"(b)"] = R"(<>bb)";

    value[R"(x_y_z)"] = R"({0},{1}.{2}-{3}**{4}////{5}=={6} {7} {8} {9})";

    if (Config::AutoEscapeHTML) {
        test.IsEqual(
            Template::Render(
                R"({svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}})",
                value, ss),
            R"(g,&apos;a.e-8000000000007779999999**10////true==ccc dddd &lt;&gt;bb f)", __LINE__);
    } else {
        test.IsEqual(
            Template::Render(
                R"({svar:x_y_z, {var:ffffff}, {var:a}, {var:4}, {var:999999999}, {var:g}, {var:h}, {var:c}, {var:d}, {var:b}, {var:e}})",
                value, ss),
            R"(g,'a.e-8000000000007779999999**10////true==ccc dddd <>bb f)", __LINE__);
    }

    ss.Clear();

    test.IsEqual(
        Template::Render(
            R"({svar:x_y_z, {raw:ffffff}, {raw:a}, {raw:4}, {raw:999999999}, {raw:g}, {raw:h}, {raw:c}, {raw:d}, {raw:b}, {raw:e}})",
            value, ss),
        R"(g,'a.e-8000000000007779999999**10////true==ccc dddd <>bb f)", __LINE__);
    ss.Clear();

    value[R"(a)"] = 10;
    value[R"(b)"] = 5;
    value[R"(c)"] = 3;

    value[R"(x_y_z)"] = R"({0} {1} {2} {3} {4})";

    test.IsEqual(Template::Render(R"({svar:x_y_z, {math:{var:a}+{var:b}+{var:c}},
    {math:{var:a}*{var:b}*{var:c}},
    {math:{var:a}-{var:b}-{var:c}},
    {math:{var:a}+{var:b}-{var:c}},
    {math:{var:a}/{var:b}+{var:c}}})",
                                  value, ss),
                 R"(18 150 2 12 5)", __LINE__);
}